

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cc
# Opt level: O2

void __thiscall
phosg::expectation_failed::expectation_failed
          (expectation_failed *this,char *msg,char *file,uint64_t line)

{
  string sStack_48;
  
  string_printf_abi_cxx11_(&sStack_48,"failure at %s:%lu: %s",file,line,msg);
  ::std::logic_error::logic_error(&this->super_logic_error,(string *)&sStack_48);
  ::std::__cxx11::string::~string((string *)&sStack_48);
  *(undefined ***)this = &PTR__logic_error_00145a60;
  this->msg = msg;
  this->file = file;
  this->line = line;
  return;
}

Assistant:

expectation_failed::expectation_failed(const char* msg, const char* file, uint64_t line)
    : logic_error(string_printf("failure at %s:%" PRIu64 ": %s", file, line, msg)),
      msg(msg),
      file(file),
      line(line) {}